

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

void __thiscall
QItemDelegate::drawBackground
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index)

{
  Int IVar1;
  QBrush *pQVar2;
  long in_RDX;
  QPoint *in_RSI;
  long in_FS_OFFSET;
  bool bVar3;
  ColorGroup cg;
  QPointF oldBO;
  QVariant value;
  undefined4 in_stack_ffffffffffffff48;
  StateFlag in_stack_ffffffffffffff4c;
  QPointF *in_stack_ffffffffffffff50;
  QPoint *pQVar4;
  QPainter *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int arole;
  QModelIndex *in_stack_ffffffffffffff68;
  bool local_86;
  ColorRole local_84;
  QBrush local_60 [8];
  QPoint local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_34;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_30;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_2c;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  arole = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  if ((*(byte *)(in_RDX + 0x68) & 1) != 0) {
    local_2c.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c
                   );
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    bVar3 = IVar1 != 0;
  }
  if (bVar3) {
    local_30.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c
                   );
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
    local_84 = (ColorRole)(IVar1 == 0);
    local_86 = false;
    if (local_84 == WindowText) {
      local_34.super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorage<QStyle::StateFlag>)
           QFlags<QStyle::StateFlag>::operator&
                     ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff50,
                      in_stack_ffffffffffffff4c);
      local_86 = QFlags<QStyle::StateFlag>::operator!((QFlags<QStyle::StateFlag> *)&local_34);
    }
    if (local_86 != false) {
      local_84 = Light;
    }
    QPalette::brush((int)in_RDX + 0x28,local_84);
    QPainter::fillRect((QRect *)in_RSI,(QBrush *)(in_RDX + 0x10));
  }
  else {
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::data(in_stack_ffffffffffffff68,arole);
    bVar3 = ::QVariant::canConvert<QBrush>((QVariant *)in_stack_ffffffffffffff50);
    if (bVar3) {
      local_48 = 0xffffffffffffffff;
      local_40 = 0xffffffffffffffff;
      local_50 = QPainter::brushOrigin();
      QPointF::QPointF(in_stack_ffffffffffffff50,
                       (QPoint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      pQVar4 = in_RSI;
      local_58 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48));
      QPainter::setBrushOrigin(in_stack_ffffffffffffff58,pQVar4);
      pQVar2 = (QBrush *)(in_RDX + 0x10);
      pQVar4 = in_RSI;
      qvariant_cast<QBrush>((QVariant *)in_stack_ffffffffffffff68);
      QPainter::fillRect((QRect *)pQVar4,pQVar2);
      QBrush::~QBrush(local_60);
      QPainter::setBrushOrigin((QPointF *)in_RSI);
    }
    ::QVariant::~QVariant((QVariant *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawBackground(QPainter *painter,
                                   const QStyleOptionViewItem &option,
                                   const QModelIndex &index) const
{
    if (option.showDecorationSelected && (option.state & QStyle::State_Selected)) {
        QPalette::ColorGroup cg = option.state & QStyle::State_Enabled
                                  ? QPalette::Normal : QPalette::Disabled;
        if (cg == QPalette::Normal && !(option.state & QStyle::State_Active))
            cg = QPalette::Inactive;

        painter->fillRect(option.rect, option.palette.brush(cg, QPalette::Highlight));
    } else {
        QVariant value = index.data(Qt::BackgroundRole);
        if (value.canConvert<QBrush>()) {
            QPointF oldBO = painter->brushOrigin();
            painter->setBrushOrigin(option.rect.topLeft());
            painter->fillRect(option.rect, qvariant_cast<QBrush>(value));
            painter->setBrushOrigin(oldBO);
        }
    }
}